

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O0

ValueType __thiscall
draco::PointAttribute::DeduplicateValues
          (PointAttribute *this,GeometryAttribute *in_att,AttributeValueIndex in_att_offset)

{
  DataType DVar1;
  AttributeValueIndex in_EDX;
  GeometryAttribute *in_RSI;
  ValueType unique_vals;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  AttributeValueIndex in_stack_ffffffffffffffe0;
  ValueType local_1c;
  ValueType local_4;
  
  DVar1 = GeometryAttribute::data_type(in_RSI);
  switch(DVar1) {
  case DT_INT8:
    local_1c = DeduplicateTypedValues<signed_char>
                         ((PointAttribute *)CONCAT44(in_EDX.value_,in_stack_ffffffffffffffd8),
                          (GeometryAttribute *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffe0);
    break;
  case DT_UINT8:
  case DT_BOOL:
    local_1c = DeduplicateTypedValues<unsigned_char>
                         ((PointAttribute *)CONCAT44(in_stack_ffffffffffffffdc,in_EDX.value_),
                          (GeometryAttribute *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffe0);
    break;
  case DT_INT16:
    local_1c = DeduplicateTypedValues<short>
                         ((PointAttribute *)
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          (GeometryAttribute *)CONCAT44(in_stack_ffffffffffffffd4,in_EDX.value_),
                          in_stack_ffffffffffffffe0);
    break;
  case DT_UINT16:
    local_1c = DeduplicateTypedValues<unsigned_short>
                         ((PointAttribute *)
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          (GeometryAttribute *)CONCAT44(in_EDX.value_,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffe0);
    break;
  case DT_INT32:
    local_1c = DeduplicateTypedValues<int>
                         ((PointAttribute *)
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          (GeometryAttribute *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffe0);
    break;
  case DT_UINT32:
    local_1c = DeduplicateTypedValues<unsigned_int>
                         ((PointAttribute *)
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          (GeometryAttribute *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffe0);
    break;
  default:
    return 0xffffffff;
  case DT_FLOAT32:
    local_1c = DeduplicateTypedValues<float>
                         ((PointAttribute *)
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                          (GeometryAttribute *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_EDX);
  }
  if (local_1c == 0) {
    local_4 = 0xffffffff;
  }
  else {
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

AttributeValueIndex::ValueType PointAttribute::DeduplicateValues(
    const GeometryAttribute &in_att, AttributeValueIndex in_att_offset) {
  AttributeValueIndex::ValueType unique_vals = 0;
  switch (in_att.data_type()) {
    // Currently we support only float, uint8, and uint16 arguments.
    case DT_FLOAT32:
      unique_vals = DeduplicateTypedValues<float>(in_att, in_att_offset);
      break;
    case DT_INT8:
      unique_vals = DeduplicateTypedValues<int8_t>(in_att, in_att_offset);
      break;
    case DT_UINT8:
    case DT_BOOL:
      unique_vals = DeduplicateTypedValues<uint8_t>(in_att, in_att_offset);
      break;
    case DT_UINT16:
      unique_vals = DeduplicateTypedValues<uint16_t>(in_att, in_att_offset);
      break;
    case DT_INT16:
      unique_vals = DeduplicateTypedValues<int16_t>(in_att, in_att_offset);
      break;
    case DT_UINT32:
      unique_vals = DeduplicateTypedValues<uint32_t>(in_att, in_att_offset);
      break;
    case DT_INT32:
      unique_vals = DeduplicateTypedValues<int32_t>(in_att, in_att_offset);
      break;
    default:
      return -1;  // Unsupported data type.
  }
  if (unique_vals == 0) {
    return -1;  // Unexpected error.
  }
  return unique_vals;
}